

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op)

{
  xmlXPathCompExprPtr pxVar1;
  xmlXPathStepOp *pxVar2;
  int *piVar3;
  xmlXPathObjectPtr *ppxVar4;
  int iVar5;
  int iVar6;
  xmlXPathOp xVar7;
  uint uVar8;
  int iVar9;
  xmlXPathContextPtr pxVar10;
  long lVar11;
  xmlXPathObjectPtr pxVar12;
  xmlChar *pxVar13;
  xmlXPathFunction p_Var14;
  xmlNodeSetPtr pxVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  xmlChar *name;
  xmlXPathObjectPtr pxVar19;
  xmlNodePtr first;
  xmlNodePtr local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (ctxt->error != 0) {
    return 0;
  }
  pxVar10 = ctxt->context;
  if (pxVar10->opLimit != 0) {
    iVar5 = xmlXPathCheckOpLimit(ctxt,1);
    if (iVar5 < 0) {
      return 0;
    }
    pxVar10 = ctxt->context;
  }
  if (4999 < pxVar10->depth) {
    iVar5 = 0x1a;
    goto LAB_001c4237;
  }
  pxVar10->depth = pxVar10->depth + 1;
  xVar7 = op->op;
  if (XPATH_OP_SORT < xVar7) {
    iVar5 = 10;
    goto LAB_001c4237;
  }
  pxVar1 = ctxt->comp;
  switch(xVar7) {
  case XPATH_OP_END:
    break;
  case XPATH_OP_AND:
    xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    xmlXPathBooleanFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->boolval == 0)) break;
    iVar5 = ctxt->valueNr;
    if ((long)iVar5 < 1) {
      pxVar12 = (xmlXPathObjectPtr)0x0;
    }
    else {
      uVar8 = iVar5 - 1;
      ctxt->valueNr = uVar8;
      ppxVar4 = ctxt->valueTab;
      if (iVar5 == 1) {
        pxVar12 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar12 = ppxVar4[(long)iVar5 + -2];
      }
      ctxt->value = pxVar12;
      pxVar12 = ppxVar4[uVar8];
      ppxVar4[uVar8] = (xmlXPathObjectPtr)0x0;
    }
    iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    xVar7 = xVar7 + iVar5;
    if (ctxt->error != 0) {
LAB_001c4b4c:
      xmlXPathFreeObject(pxVar12);
      break;
    }
    xmlXPathBooleanFunction(ctxt,1);
    if (ctxt->value != (xmlXPathObjectPtr)0x0) {
      piVar3 = &ctxt->value->boolval;
      *piVar3 = *piVar3 & pxVar12->boolval;
    }
    goto LAB_001c4b77;
  case XPATH_OP_OR:
    xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    xmlXPathBooleanFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->boolval == 1)) break;
    iVar5 = ctxt->valueNr;
    if ((long)iVar5 < 1) {
      pxVar12 = (xmlXPathObjectPtr)0x0;
    }
    else {
      uVar8 = iVar5 - 1;
      ctxt->valueNr = uVar8;
      ppxVar4 = ctxt->valueTab;
      if (iVar5 == 1) {
        pxVar12 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar12 = ppxVar4[(long)iVar5 + -2];
      }
      ctxt->value = pxVar12;
      pxVar12 = ppxVar4[uVar8];
      ppxVar4[uVar8] = (xmlXPathObjectPtr)0x0;
    }
    iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    xVar7 = xVar7 + iVar5;
    if (ctxt->error != 0) goto LAB_001c4b4c;
    xmlXPathBooleanFunction(ctxt,1);
    if (ctxt->value != (xmlXPathObjectPtr)0x0) {
      piVar3 = &ctxt->value->boolval;
      *piVar3 = *piVar3 | pxVar12->boolval;
    }
LAB_001c4b77:
    pxVar10 = ctxt->context;
LAB_001c4b7e:
    xmlXPathReleaseObject(pxVar10,pxVar12);
    break;
  case XPATH_OP_EQUAL:
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    if (op->value == 0) {
      iVar5 = xmlXPathNotEqualValues(ctxt);
    }
    else {
      iVar5 = xmlXPathEqualValues(ctxt);
    }
    xVar7 = iVar6 + iVar9;
    goto LAB_001c49bb;
  case XPATH_OP_CMP:
    iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    xVar7 = iVar9 + iVar5;
    iVar5 = xmlXPathCompareValues(ctxt,op->value,op->value2);
LAB_001c49bb:
    pxVar12 = xmlXPathCacheNewBoolean(ctxt,iVar5);
    goto LAB_001c49cb;
  case XPATH_OP_PLUS:
    xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar7 = iVar5 + xVar7;
    }
    switch(op->value) {
    case 0:
      xmlXPathSubValues(ctxt);
      break;
    case 1:
      xmlXPathAddValues(ctxt);
      break;
    case 2:
      xmlXPathValueFlipSign(ctxt);
      break;
    case 3:
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        if (ctxt->value->type == XPATH_NUMBER) break;
        xmlXPathNumberFunction(ctxt,1);
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NUMBER)) break;
      }
LAB_001c4d03:
      iVar5 = 0xb;
LAB_001c4237:
      xmlXPathErr(ctxt,iVar5);
      return 0;
    }
    break;
  case XPATH_OP_MULT:
    iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    xVar7 = iVar9 + iVar5;
    iVar5 = op->value;
    if (iVar5 == 2) {
      xmlXPathModValues(ctxt);
    }
    else if (iVar5 == 1) {
      xmlXPathDivValues(ctxt);
    }
    else if (iVar5 == 0) {
      xmlXPathMultValues(ctxt);
    }
    break;
  case XPATH_OP_UNION:
    iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar6 = ctxt->valueNr;
    if ((long)iVar6 < 1) {
      pxVar12 = (xmlXPathObjectPtr)0x0;
LAB_001c4ce8:
      pxVar19 = (xmlXPathObjectPtr)0x0;
LAB_001c4ceb:
      xmlXPathReleaseObject(ctxt->context,pxVar19);
      xmlXPathReleaseObject(ctxt->context,pxVar12);
      goto LAB_001c4d03;
    }
    uVar8 = iVar6 - 1;
    ctxt->valueNr = uVar8;
    ppxVar4 = ctxt->valueTab;
    if (iVar6 == 1) {
      pxVar19 = (xmlXPathObjectPtr)0x0;
      ctxt->value = (xmlXPathObjectPtr)0x0;
      pxVar12 = ppxVar4[uVar8];
      ppxVar4[uVar8] = (xmlXPathObjectPtr)0x0;
      goto LAB_001c4ceb;
    }
    ctxt->value = ppxVar4[(long)iVar6 + -2];
    pxVar12 = ppxVar4[uVar8];
    ppxVar4[uVar8] = (xmlXPathObjectPtr)0x0;
    uVar16 = iVar6 - 2;
    ctxt->valueNr = uVar16;
    ppxVar4 = ctxt->valueTab;
    if (uVar8 == 1) {
      pxVar19 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar19 = ppxVar4[(ulong)uVar8 - 2];
    }
    ctxt->value = pxVar19;
    pxVar19 = ppxVar4[uVar16];
    ppxVar4[uVar16] = (xmlXPathObjectPtr)0x0;
    if (pxVar19 == (xmlXPathObjectPtr)0x0) goto LAB_001c4ce8;
    if (((pxVar19->type != XPATH_NODESET) || (pxVar12 == (xmlXPathObjectPtr)0x0)) ||
       (pxVar12->type != XPATH_NODESET)) goto LAB_001c4ceb;
    xVar7 = iVar9 + iVar5;
    if ((ctxt->context->opLimit == 0) ||
       (((pxVar19->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar5 = xmlXPathCheckOpLimit(ctxt,(long)pxVar19->nodesetval->nodeNr), -1 < iVar5)) &&
        ((pxVar12->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar5 = xmlXPathCheckOpLimit(ctxt,(long)pxVar12->nodesetval->nodeNr), -1 < iVar5)))))) {
      pxVar15 = pxVar12->nodesetval;
      if ((pxVar15 != (xmlNodeSetPtr)0x0) && (pxVar15->nodeNr != 0)) {
        pxVar15 = xmlXPathNodeSetMerge(pxVar19->nodesetval,pxVar15);
        pxVar19->nodesetval = pxVar15;
        if (pxVar15 == (xmlNodeSetPtr)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
      }
      xmlXPathValuePush(ctxt,pxVar19);
    }
    else {
      xmlXPathReleaseObject(ctxt->context,pxVar19);
    }
    pxVar10 = ctxt->context;
    goto LAB_001c4b7e;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    goto LAB_001c47d3;
  case XPATH_OP_NODE:
    xVar7 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar7 = iVar5 + xVar7;
    }
    pxVar12 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    goto LAB_001c49cb;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar9 = xmlXPathNodeCollectAndTest(ctxt,op,(xmlNodePtr *)0x0,(xmlNodePtr *)0x0,0);
      xVar7 = iVar9 + iVar5;
      break;
    }
    goto LAB_001c47d3;
  case XPATH_OP_VALUE:
    pxVar12 = xmlXPathCacheObjectCopy(ctxt,(xmlXPathObjectPtr)op->value4);
    xmlXPathValuePush(ctxt,pxVar12);
LAB_001c47d3:
    xVar7 = XPATH_OP_END;
    break;
  case XPATH_OP_VARIABLE:
    if ((long)op->ch1 == -1) {
      xVar7 = XPATH_OP_END;
    }
    else {
      xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    }
    if ((xmlChar *)op->value5 == (xmlChar *)0x0) {
      pxVar12 = xmlXPathVariableLookup(ctxt->context,(xmlChar *)op->value4);
    }
    else {
      pxVar13 = xmlXPathNsLookup(ctxt->context,(xmlChar *)op->value5);
      if (pxVar13 == (xmlChar *)0x0) {
LAB_001c498e:
        iVar5 = 0x13;
        goto LAB_001c4996;
      }
      pxVar12 = xmlXPathVariableLookupNS(ctxt->context,(xmlChar *)op->value4,pxVar13);
    }
    if (pxVar12 == (xmlXPathObjectPtr)0x0) {
      iVar5 = 5;
LAB_001c4996:
      xmlXPathErr(ctxt,iVar5);
      return 0;
    }
    goto LAB_001c49cb;
  case XPATH_OP_FUNCTION:
    iVar5 = ctxt->valueNr;
    if ((long)op->ch1 == -1) {
      xVar7 = XPATH_OP_END;
      iVar9 = iVar5;
    }
    else {
      xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
      if (ctxt->error != 0) break;
      iVar9 = ctxt->valueNr;
    }
    uVar8 = op->value;
    uVar18 = (ulong)uVar8;
    if (iVar9 < (int)(uVar8 + iVar5)) {
LAB_001c4926:
      iVar5 = 10;
      goto LAB_001c4996;
    }
    if (0 < (int)uVar8) {
      do {
        iVar9 = iVar9 + -1;
        if (ctxt->valueTab[iVar9] == (xmlXPathObjectPtr)0x0) goto LAB_001c4926;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    p_Var14 = op->cache;
    if (p_Var14 == (xmlXPathFunction)0x0) {
      pxVar10 = ctxt->context;
      if ((xmlChar *)op->value5 == (xmlChar *)0x0) {
        name = (xmlChar *)op->value4;
        pxVar13 = (xmlChar *)0x0;
      }
      else {
        pxVar13 = xmlXPathNsLookup(pxVar10,(xmlChar *)op->value5);
        if (pxVar13 == (xmlChar *)0x0) goto LAB_001c498e;
        pxVar10 = ctxt->context;
        name = (xmlChar *)op->value4;
      }
      p_Var14 = xmlXPathFunctionLookupNS(pxVar10,name,pxVar13);
      if (p_Var14 == (xmlXPathFunction)0x0) {
        iVar5 = 9;
        goto LAB_001c4996;
      }
      op->cache = p_Var14;
      op->cacheURI = pxVar13;
      uVar8 = op->value;
    }
    else {
      pxVar13 = (xmlChar *)op->cacheURI;
    }
    pxVar10 = ctxt->context;
    local_48 = *(undefined4 *)&pxVar10->function;
    uStack_44 = *(undefined4 *)((long)&pxVar10->function + 4);
    uStack_40 = *(undefined4 *)&pxVar10->functionURI;
    uStack_3c = *(undefined4 *)((long)&pxVar10->functionURI + 4);
    pxVar10->function = (xmlChar *)op->value4;
    pxVar10->functionURI = pxVar13;
    (*p_Var14)(ctxt,uVar8);
    pxVar10 = ctxt->context;
    pxVar10->function = (xmlChar *)CONCAT44(uStack_44,local_48);
    pxVar10->functionURI = (xmlChar *)CONCAT44(uStack_3c,uStack_40);
    if ((ctxt->error == 0) && (ctxt->valueNr != iVar5 + 1)) {
      iVar5 = 0x17;
      goto LAB_001c4996;
    }
    break;
  case XPATH_OP_ARG:
    if ((long)op->ch1 == -1) {
      xVar7 = XPATH_OP_END;
    }
    else {
      xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
    }
    if ((long)op->ch2 != -1) {
      iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar7 = iVar5 + xVar7;
    }
    break;
  default:
    iVar5 = op->ch1;
    lVar17 = (long)iVar5;
    xVar7 = XPATH_OP_END;
    if (lVar17 != -1) {
      lVar11 = (long)op->ch2;
      if (lVar11 != -1) {
        pxVar2 = pxVar1->steps;
        if (((((pxVar2[lVar17].op & ~XPATH_OP_AND) == XPATH_OP_FILTER) &&
             (pxVar2[lVar11].op == XPATH_OP_VALUE)) &&
            ((piVar3 = (int *)pxVar2[lVar11].value4, piVar3 != (int *)0x0 &&
             ((*piVar3 == 3 && (*(double *)(piVar3 + 6) == 1.0)))))) &&
           (!NAN(*(double *)(piVar3 + 6)))) {
          local_50 = (xmlNodePtr)0x0;
          xVar7 = xmlXPathCompOpEvalFirst(ctxt,pxVar2 + lVar17,&local_50);
          iVar5 = 1;
          if (ctxt->error == 0) {
            pxVar12 = ctxt->value;
            iVar5 = 2;
            if ((((pxVar12 != (xmlXPathObjectPtr)0x0) && (pxVar12->type == XPATH_NODESET)) &&
                (pxVar15 = pxVar12->nodesetval, pxVar15 != (xmlNodeSetPtr)0x0)) &&
               (1 < pxVar15->nodeNr)) {
              xmlXPathNodeSetClearFromPos(pxVar15,1,1);
            }
          }
LAB_001c430c:
          if (iVar5 != 2) {
            return 0;
          }
          break;
        }
        pxVar2 = pxVar1->steps;
        if (((pxVar2[lVar17].op == XPATH_OP_SORT) && (pxVar2[lVar11].op == XPATH_OP_SORT)) &&
           ((((lVar17 = (long)pxVar2[lVar11].ch1, lVar17 != -1 &&
              ((pxVar2[lVar17].op == XPATH_OP_FUNCTION && (pxVar2[lVar17].value5 == (void *)0x0))))
             && (pxVar2[lVar17].value == 0)) && ((xmlChar *)pxVar2[lVar17].value4 != (xmlChar *)0x0)
            ))) {
          iVar9 = xmlStrEqual((xmlChar *)pxVar2[lVar17].value4,(xmlChar *)"last");
          iVar5 = op->ch1;
          if (iVar9 != 0) {
            local_50 = (xmlNodePtr)0x0;
            xVar7 = xmlXPathCompOpEvalLast(ctxt,pxVar1->steps + iVar5,&local_50);
            iVar5 = 1;
            if (ctxt->error == 0) {
              pxVar12 = ctxt->value;
              iVar5 = 2;
              if ((((pxVar12 != (xmlXPathObjectPtr)0x0) && (pxVar12->type == XPATH_NODESET)) &&
                  (pxVar15 = pxVar12->nodesetval, pxVar15 != (xmlNodeSetPtr)0x0)) &&
                 ((pxVar15->nodeTab != (xmlNodePtr *)0x0 && (1 < pxVar15->nodeNr)))) {
                xmlXPathNodeSetKeepLast(pxVar15);
              }
            }
            goto LAB_001c430c;
          }
          xVar7 = XPATH_OP_END;
          if (iVar5 == -1) goto LAB_001c483d;
        }
      }
      xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + iVar5);
    }
LAB_001c483d:
    if (ctxt->error != 0) {
      return 0;
    }
    iVar5 = op->ch2;
    if ((iVar5 == -1) || (ctxt->value == (xmlXPathObjectPtr)0x0)) break;
    if (ctxt->value->type != XPATH_NODESET) goto LAB_001c4d03;
    iVar9 = ctxt->valueNr;
    if ((long)iVar9 < 1) {
      pxVar12 = (xmlXPathObjectPtr)0x0;
    }
    else {
      uVar8 = iVar9 - 1;
      ctxt->valueNr = uVar8;
      ppxVar4 = ctxt->valueTab;
      if (iVar9 == 1) {
        pxVar12 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar12 = ppxVar4[(long)iVar9 + -2];
      }
      ctxt->value = pxVar12;
      pxVar12 = ppxVar4[uVar8];
      ppxVar4[uVar8] = (xmlXPathObjectPtr)0x0;
    }
    pxVar15 = pxVar12->nodesetval;
    if (pxVar15 != (xmlNodeSetPtr)0x0) {
      xmlXPathNodeSetFilter(ctxt,pxVar15,iVar5,1,pxVar15->nodeNr,1);
    }
LAB_001c49cb:
    xmlXPathValuePush(ctxt,pxVar12);
    break;
  case XPATH_OP_SORT:
    xVar7 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar12 = ctxt->value;
    if ((((pxVar12 != (xmlXPathObjectPtr)0x0) && (pxVar12->type == XPATH_NODESET)) &&
        (pxVar15 = pxVar12->nodesetval, pxVar15 != (xmlNodeSetPtr)0x0)) &&
       (1 < (long)pxVar15->nodeNr)) {
      libxml_domnode_tim_sort(pxVar15->nodeTab,(long)pxVar15->nodeNr);
    }
  }
  piVar3 = &ctxt->context->depth;
  *piVar3 = *piVar3 + -1;
  return xVar7;
}

Assistant:

static int
xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt, xmlXPathStepOpPtr op)
{
    int total = 0;
    int equal, ret;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_AND:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 0))
                break;
            arg2 = xmlXPathValuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval &= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_OR:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 1))
                break;
            arg2 = xmlXPathValuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval |= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_EQUAL:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    if (op->value)
		equal = xmlXPathEqualValues(ctxt);
	    else
		equal = xmlXPathNotEqualValues(ctxt);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, equal));
            break;
        case XPATH_OP_CMP:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            ret = xmlXPathCompareValues(ctxt, op->value, op->value2);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
            break;
        case XPATH_OP_PLUS:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    }
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathSubValues(ctxt);
            else if (op->value == 1)
                xmlXPathAddValues(ctxt);
            else if (op->value == 2)
                xmlXPathValueFlipSign(ctxt);
            else if (op->value == 3) {
                CAST_TO_NUMBER;
                CHECK_TYPE0(XPATH_NUMBER);
            }
            break;
        case XPATH_OP_MULT:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathMultValues(ctxt);
            else if (op->value == 1)
                xmlXPathDivValues(ctxt);
            else if (op->value == 2)
                xmlXPathModValues(ctxt);
            break;
        case XPATH_OP_UNION:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;

            arg2 = xmlXPathValuePop(ctxt);
            arg1 = xmlXPathValuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

	    if (((arg2->nodesetval != NULL) &&
		 (arg2->nodesetval->nodeNr != 0)))
	    {
		arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
							arg2->nodesetval);
                if (arg1->nodesetval == NULL)
                    xmlXPathPErrMemory(ctxt);
	    }

            xmlXPathValuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
                                                    ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, NULL, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            xmlXPathValuePush(ctxt, xmlXPathCacheObjectCopy(ctxt, op->value4));
            break;
        case XPATH_OP_VARIABLE:{
		xmlXPathObjectPtr val;

                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                if (op->value5 == NULL) {
		    val = xmlXPathVariableLookup(ctxt->context, op->value4);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    xmlXPathValuePush(ctxt, val);
		} else {
                    const xmlChar *URI;

                    URI = xmlXPathNsLookup(ctxt->context, op->value5);
                    if (URI == NULL) {
                        XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        break;
                    }
		    val = xmlXPathVariableLookupNS(ctxt->context,
                                                       op->value4, URI);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    xmlXPathValuePush(ctxt, val);
                }
                break;
            }
        case XPATH_OP_FUNCTION:{
                xmlXPathFunction func;
                const xmlChar *oldFunc, *oldFuncURI;
		int i;
                int frame;

                frame = ctxt->valueNr;
                if (op->ch1 != -1) {
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                    if (ctxt->error != XPATH_EXPRESSION_OK)
                        break;
                }
		if (ctxt->valueNr < frame + op->value)
		    XP_ERROR0(XPATH_INVALID_OPERAND);
		for (i = 0; i < op->value; i++) {
		    if (ctxt->valueTab[(ctxt->valueNr - 1) - i] == NULL)
			XP_ERROR0(XPATH_INVALID_OPERAND);
                }
                if (op->cache != NULL)
                    func = op->cache;
                else {
                    const xmlChar *URI = NULL;

                    if (op->value5 == NULL)
                        func =
                            xmlXPathFunctionLookup(ctxt->context,
                                                   op->value4);
                    else {
                        URI = xmlXPathNsLookup(ctxt->context, op->value5);
                        if (URI == NULL)
                            XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        func = xmlXPathFunctionLookupNS(ctxt->context,
                                                        op->value4, URI);
                    }
                    if (func == NULL)
                        XP_ERROR0(XPATH_UNKNOWN_FUNC_ERROR);
                    op->cache = func;
                    op->cacheURI = (void *) URI;
                }
                oldFunc = ctxt->context->function;
                oldFuncURI = ctxt->context->functionURI;
                ctxt->context->function = op->value4;
                ctxt->context->functionURI = op->cacheURI;
                func(ctxt, op->value);
                ctxt->context->function = oldFunc;
                ctxt->context->functionURI = oldFuncURI;
                if ((ctxt->error == XPATH_EXPRESSION_OK) &&
                    (ctxt->valueNr != frame + 1))
                    XP_ERROR0(XPATH_STACK_ERROR);
                break;
            }
        case XPATH_OP_ARG:
            if (op->ch1 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	        CHECK_ERROR0;
            }
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	        CHECK_ERROR0;
	    }
            break;
        case XPATH_OP_PREDICATE:
        case XPATH_OP_FILTER:{
                xmlXPathObjectPtr obj;
                xmlNodeSetPtr set;

                /*
                 * Optimization for ()[1] selection i.e. the first elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
#ifdef XP_OPTIMIZED_FILTER_FIRST
		    /*
		    * FILTER TODO: Can we assume that the inner processing
		    *  will result in an ordered list if we have an
		    *  XPATH_OP_FILTER?
		    *  What about an additional field or flag on
		    *  xmlXPathObject like @sorted ? This way we wouldn't need
		    *  to assume anything, so it would be more robust and
		    *  easier to optimize.
		    */
                    ((comp->steps[op->ch1].op == XPATH_OP_SORT) || /* 18 */
		     (comp->steps[op->ch1].op == XPATH_OP_FILTER)) && /* 17 */
#else
		    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
#endif
                    (comp->steps[op->ch2].op == XPATH_OP_VALUE)) { /* 12 */
                    xmlXPathObjectPtr val;

                    val = comp->steps[op->ch2].value4;
                    if ((val != NULL) && (val->type == XPATH_NUMBER) &&
                        (val->floatval == 1.0)) {
                        xmlNodePtr first = NULL;

                        total +=
                            xmlXPathCompOpEvalFirst(ctxt,
                                                    &comp->steps[op->ch1],
                                                    &first);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the first value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetClearFromPos(ctxt->value->nodesetval,
                                                        1, 1);
                        break;
                    }
                }
                /*
                 * Optimization for ()[last()] selection i.e. the last elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
                    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
                    (comp->steps[op->ch2].op == XPATH_OP_SORT)) {
                    int f = comp->steps[op->ch2].ch1;

                    if ((f != -1) &&
                        (comp->steps[f].op == XPATH_OP_FUNCTION) &&
                        (comp->steps[f].value5 == NULL) &&
                        (comp->steps[f].value == 0) &&
                        (comp->steps[f].value4 != NULL) &&
                        (xmlStrEqual
                         (comp->steps[f].value4, BAD_CAST "last"))) {
                        xmlNodePtr last = NULL;

                        total +=
                            xmlXPathCompOpEvalLast(ctxt,
                                                   &comp->steps[op->ch1],
                                                   &last);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the last value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeTab != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
                        break;
                    }
                }
		/*
		* Process inner predicates first.
		* Example "index[parent::book][1]":
		* ...
		*   PREDICATE   <-- we are here "[1]"
		*     PREDICATE <-- process "[parent::book]" first
		*       SORT
		*         COLLECT  'parent' 'name' 'node' book
		*           NODE
		*     ELEM Object is a number : 1
		*/
                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;
                if (op->ch2 == -1)
                    break;
                if (ctxt->value == NULL)
                    break;

                /*
                 * In case of errors, xmlXPathNodeSetFilter can pop additional
                 * nodes from the stack. We have to temporarily remove the
                 * nodeset object from the stack to avoid freeing it
                 * prematurely.
                 */
                CHECK_TYPE0(XPATH_NODESET);
                obj = xmlXPathValuePop(ctxt);
                set = obj->nodesetval;
                if (set != NULL)
                    xmlXPathNodeSetFilter(ctxt, set, op->ch2,
                                          1, set->nodeNr, 1);
                xmlXPathValuePush(ctxt, obj);
                break;
            }
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL) &&
                (ctxt->value->type == XPATH_NODESET) &&
                (ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1))
	    {
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
	    }
            break;
        default:
            XP_ERROR0(XPATH_INVALID_OPERAND);
            break;
    }

    ctxt->context->depth -= 1;
    return (total);
}